

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall ByteData_SplitData_Test::TestBody(ByteData_SplitData_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  string local_248;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  Message local_1b0;
  string local_1a8;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  string local_168;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130;
  size_type local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  uint local_100 [2];
  iterator local_f8;
  size_type local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  undefined1 local_d0 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> list;
  Message local_b0;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ByteData sub_data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData data;
  ByteData_SplitData_Test *this_local;
  
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"00112233444444444444444444444444444444444444444455555555",
             &local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::ByteData::SplitData((ByteData *)&gtest_ar.message_,(ByteData *)local_28,4);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a8,(ByteData *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_88,"\"00112233\"","sub_data.GetHex()",(char (*) [9])0x7660b2,
             &local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_100[0] = 4;
  local_100[1] = 0x14;
  local_f8 = local_100;
  local_f0 = 2;
  this_00 = (allocator<unsigned_int> *)((long)&gtest_ar_1.message_.ptr_ + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e8,__l,this_00);
  cfd::core::ByteData::SplitData
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d0,
             (ByteData *)local_28,&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_11c = 2;
  local_128 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         local_d0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_118,"2","list.size()",&local_11c,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  sVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d0);
  if (sVar3 == 2) {
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        local_d0,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_168,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((EqHelper<false> *)local_148,"\"00112233\"","list[0].GetHex()",(char (*) [9])0x7660b2
               ,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xf8,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        local_d0,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1a8,pvVar4);
    testing::internal::EqHelper<false>::Compare<char[41],std::__cxx11::string>
              ((EqHelper<false> *)local_188,"\"4444444444444444444444444444444444444444\"",
               "list[1].GetHex()",(char (*) [41])0x6ce181,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xf9,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        local_d0,0);
    local_1c9 = cfd::core::ByteData::operator==((ByteData *)&gtest_ar.message_,pvVar4);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_1c8,
                 (AssertionResult *)"sub_data == list[0]","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xfa,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        local_d0,1);
    bVar1 = cfd::core::ByteData::operator==((ByteData *)&gtest_ar.message_,pvVar4);
    local_211 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_210,&local_211,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_248,(internal *)local_210,(AssertionResult *)"sub_data == list[1]","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xfb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      testing::Message::~Message(&local_220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d0);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(ByteData, SplitData) {
  ByteData data("00112233444444444444444444444444444444444444444455555555");
  auto sub_data = data.SplitData(4);
  EXPECT_EQ("00112233", sub_data.GetHex());
  auto list = data.SplitData(std::vector<uint32_t>{4, 20});
  EXPECT_EQ(2, list.size());
  if (list.size() == 2) {
    EXPECT_EQ("00112233", list[0].GetHex());
    EXPECT_EQ("4444444444444444444444444444444444444444", list[1].GetHex());
    EXPECT_TRUE(sub_data == list[0]);
    EXPECT_FALSE(sub_data == list[1]);
  }
}